

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O3

int Extra_TruthMinCofSuppOverlap(uint *pTruth,int nVars,int *pVarMin)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  int iVar;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  
  if (9 < nVars) {
    __assert_fail("nVars <= 9",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilTruth.c"
                  ,0x30d,"int Extra_TruthMinCofSuppOverlap(unsigned int *, int, int *)");
  }
  if (nVars < 1) {
    uVar1 = 0x20;
    iVar5 = -1;
  }
  else {
    uVar1 = 1 << ((char)nVars - 5U & 0x1f);
    if ((uint)nVars < 6) {
      uVar1 = 1;
    }
    uVar6 = (ulong)uVar1 + 1;
    iVar5 = -1;
    iVar = 0;
    uVar3 = uVar6;
    uVar7 = 0x20;
    do {
      do {
        Extra_TruthVarsAntiSymm::uTemp1[uVar3 + 0xe] = pTruth[uVar3 - 2];
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
      Extra_TruthCofactor0(Extra_TruthMinCofSuppOverlap::uCofactor,nVars,iVar);
      uVar1 = Extra_TruthSupport(Extra_TruthMinCofSuppOverlap::uCofactor,nVars);
      uVar8 = (uVar1 >> 1 & 0x55555555) + (uVar1 & 0x55555555);
      uVar8 = (uVar8 >> 2 & 0x33333333) + (uVar8 & 0x33333333);
      uVar8 = (uVar8 >> 4 & 0x7070707) + (uVar8 & 0x7070707);
      uVar8 = (uVar8 >> 8 & 0xf000f) + (uVar8 & 0xf000f);
      uVar3 = uVar6;
      do {
        Extra_TruthVarsAntiSymm::uTemp1[uVar3 + 0xe] = pTruth[uVar3 - 2];
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
      Extra_TruthCofactor1(Extra_TruthMinCofSuppOverlap::uCofactor,nVars,iVar);
      uVar2 = Extra_TruthSupport(Extra_TruthMinCofSuppOverlap::uCofactor,nVars);
      uVar4 = (uVar2 >> 1 & 0x55555555) + (uVar2 & 0x55555555);
      uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
      uVar4 = (uVar4 >> 4 & 0x7070707) + (uVar4 & 0x7070707);
      uVar4 = (uVar4 >> 8 & 0xf000f) + (uVar4 & 0xf000f);
      uVar1 = ((uVar1 & uVar2) >> 1 & 0x55555555) + (uVar1 & uVar2 & 0x55555555);
      uVar1 = (uVar1 >> 2 & 0x33333333) + (uVar1 & 0x33333333);
      uVar1 = (uVar1 >> 4 & 0x7070707) + (uVar1 & 0x7070707);
      uVar1 = (uVar1 >> 8 & 0xf000f) + (uVar1 & 0xf000f);
      uVar1 = (uVar1 >> 0x10) + (uVar1 & 0xff);
      bVar9 = (uVar8 >> 0x10) + (uVar8 & 0xffff) < 6;
      bVar10 = (uVar4 >> 0x10) + (uVar4 & 0xff) < 6;
      if ((bVar10 && bVar9) && uVar1 < uVar7) {
        iVar5 = iVar;
      }
      if ((!bVar10 || !bVar9) || uVar7 <= uVar1) {
        uVar1 = uVar7;
      }
      if (uVar1 == 0) {
        uVar1 = 0;
        break;
      }
      iVar = iVar + 1;
      uVar3 = uVar6;
      uVar7 = uVar1;
    } while (iVar != nVars);
  }
  if (pVarMin != (int *)0x0) {
    *pVarMin = iVar5;
  }
  return uVar1;
}

Assistant:

int Extra_TruthMinCofSuppOverlap( unsigned * pTruth, int nVars, int * pVarMin )
{
    static unsigned uCofactor[16];
    int i, ValueCur, ValueMin, VarMin;
    unsigned uSupp0, uSupp1;
    int nVars0, nVars1;
    assert( nVars <= 9 );
    ValueMin = 32;
    VarMin   = -1;
    for ( i = 0; i < nVars; i++ )
    {
        // get negative cofactor
        Extra_TruthCopy( uCofactor, pTruth, nVars );
        Extra_TruthCofactor0( uCofactor, nVars, i );
        uSupp0 = Extra_TruthSupport( uCofactor, nVars );
        nVars0 = Extra_WordCountOnes( uSupp0 );
//Extra_PrintBinary( stdout, &uSupp0, 8 ); printf( "\n" );
        // get positive cofactor
        Extra_TruthCopy( uCofactor, pTruth, nVars );
        Extra_TruthCofactor1( uCofactor, nVars, i );
        uSupp1 = Extra_TruthSupport( uCofactor, nVars );
        nVars1 = Extra_WordCountOnes( uSupp1 );
//Extra_PrintBinary( stdout, &uSupp1, 8 ); printf( "\n" );
        // get the number of common vars
        ValueCur = Extra_WordCountOnes( uSupp0 & uSupp1 );
        if ( ValueMin > ValueCur && nVars0 <= 5 && nVars1 <= 5 )
        {
            ValueMin = ValueCur;
            VarMin = i;
        }
        if ( ValueMin == 0 )
            break;
    }
    if ( pVarMin )
        *pVarMin = VarMin;
    return ValueMin;
}